

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_column.h
# Opt level: O3

bool Gudhi::persistence_matrix::operator==
               (List_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>
                *c1,List_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>
                    *c2)

{
  bool bVar1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  
  if (c1 == c2) {
    return true;
  }
  if ((c1->column_).
      super__List_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>_*>_>
      ._M_impl._M_node._M_size ==
      (c2->column_).
      super__List_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>_*>_>
      ._M_impl._M_node._M_size) {
    p_Var2 = (_List_node_base *)&c2->column_;
    p_Var3 = (_List_node_base *)&c1->column_;
    while( true ) {
      p_Var3 = (((_List_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>_*>_>
                  *)&p_Var3->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      p_Var2 = (((_List_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>_*>_>
                  *)&p_Var2->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      bVar1 = p_Var2 == (_List_node_base *)&c2->column_ || p_Var3 == (_List_node_base *)&c1->column_
      ;
      if (bVar1) {
        return bVar1;
      }
      if (*(int *)((long)p_Var3[1]._M_next + 8) != *(int *)((long)p_Var2[1]._M_next + 8)) break;
      if (*(int *)((long)p_Var3[1]._M_next + 4) != *(int *)((long)p_Var2[1]._M_next + 4)) {
        return bVar1;
      }
    }
    return bVar1;
  }
  return false;
}

Assistant:

bool operator==(const List_column& c1, const List_column& c2) {
    if (&c1 == &c2) return true;

    auto it1 = c1.column_.begin();
    auto it2 = c2.column_.begin();
    if (c1.column_.size() != c2.column_.size()) return false;
    while (it1 != c1.column_.end() && it2 != c2.column_.end()) {
      if constexpr (Master_matrix::Option_list::is_z2) {
        if ((*it1)->get_row_index() != (*it2)->get_row_index()) return false;
      } else {
        if ((*it1)->get_row_index() != (*it2)->get_row_index() || (*it1)->get_element() != (*it2)->get_element())
          return false;
      }
      ++it1;
      ++it2;
    }
    return true;
  }